

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall kj::Executor::Impl::State::State(State *this,EventLoop *loop)

{
  (this->loop).ptr = loop;
  (this->start).head.ptr = (XThreadEvent *)0x0;
  (this->start).tail = &(this->start).head;
  (this->start).listSize = 0;
  (this->cancel).head.ptr = (XThreadEvent *)0x0;
  (this->cancel).tail = &(this->cancel).head;
  (this->cancel).listSize = 0;
  (this->replies).head.ptr = (XThreadEvent *)0x0;
  (this->replies).tail = &(this->replies).head;
  (this->replies).listSize = 0;
  (this->executing).head.ptr = (XThreadEvent *)0x0;
  (this->executing).tail = &(this->executing).head;
  (this->executing).listSize = 0;
  (this->fulfilled).head.ptr = (XThreadPaf *)0x0;
  (this->fulfilled).tail = &(this->fulfilled).head;
  (this->fulfilled).listSize = 0;
  this->waitingForCancel = false;
  return;
}

Assistant:

constexpr Maybe(): ptr(nullptr) {}